

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginVST2.cpp
# Opt level: O1

void __thiscall
DISTRHO::ParameterAndNotesHelper::~ParameterAndNotesHelper(ParameterAndNotesHelper *this)

{
  this->_vptr_ParameterAndNotesHelper = (_func_int **)&PTR__ParameterAndNotesHelper_0010fcc8;
  if (this->parameterValues != (float *)0x0) {
    operator_delete__(this->parameterValues);
    this->parameterValues = (float *)0x0;
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~ParameterAndNotesHelper()
    {
        if (parameterValues != nullptr)
        {
            delete[] parameterValues;
            parameterValues = nullptr;
        }
#if DISTRHO_PLUGIN_HAS_UI
        if (parameterChecks != nullptr)
        {
            delete[] parameterChecks;
            parameterChecks = nullptr;
        }
#endif
    }